

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

NTRUEncodeSchedule * ntru_encode_pubkey_schedule(uint p,uint q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined2 uVar3;
  undefined1 auVar4 [16];
  uint16_t *ms_in;
  NTRUEncodeSchedule *pNVar5;
  ulong uVar6;
  ulong factor1;
  int iVar8;
  undefined1 auVar7 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar36 [16];
  long lVar11;
  
  uVar3 = (undefined2)q;
  factor1 = (ulong)p;
  ms_in = (uint16_t *)safemalloc(factor1,2,0);
  auVar4 = _DAT_00182df0;
  if (p != 0) {
    lVar11 = factor1 - 1;
    auVar7._8_4_ = (int)lVar11;
    auVar7._0_8_ = lVar11;
    auVar7._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_00182df0;
    auVar10 = _DAT_00183340;
    auVar12 = _DAT_00183350;
    auVar13 = _DAT_00183360;
    auVar14 = _DAT_00180bd0;
    do {
      auVar15 = auVar14 ^ auVar4;
      iVar29 = auVar7._0_4_;
      iVar28 = -(uint)(iVar29 < auVar15._0_4_);
      iVar8 = auVar7._4_4_;
      auVar16._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      iVar33 = auVar7._8_4_;
      iVar32 = -(uint)(iVar33 < auVar15._8_4_);
      iVar9 = auVar7._12_4_;
      auVar16._12_4_ = -(uint)(iVar9 < auVar15._12_4_);
      auVar25._4_4_ = iVar28;
      auVar25._0_4_ = iVar28;
      auVar25._8_4_ = iVar32;
      auVar25._12_4_ = iVar32;
      auVar34 = pshuflw(in_XMM11,auVar25,0xe8);
      auVar18._4_4_ = -(uint)(auVar15._4_4_ == iVar8);
      auVar18._12_4_ = -(uint)(auVar15._12_4_ == iVar9);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar36 = pshuflw(in_XMM12,auVar18,0xe8);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar35 = pshuflw(auVar34,auVar16,0xe8);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar15 = (auVar35 | auVar36 & auVar34) ^ auVar15;
      auVar15 = packssdw(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6) = uVar3;
      }
      auVar16 = auVar18 & auVar25 | auVar16;
      auVar15 = packssdw(auVar16,auVar16);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar35,auVar15 ^ auVar35);
      if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)ms_in + uVar6 + 2) = uVar3;
      }
      auVar15 = auVar13 ^ auVar4;
      iVar28 = -(uint)(iVar29 < auVar15._0_4_);
      auVar30._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      iVar32 = -(uint)(iVar33 < auVar15._8_4_);
      auVar30._12_4_ = -(uint)(iVar9 < auVar15._12_4_);
      auVar17._4_4_ = iVar28;
      auVar17._0_4_ = iVar28;
      auVar17._8_4_ = iVar32;
      auVar17._12_4_ = iVar32;
      auVar24._4_4_ = -(uint)(auVar15._4_4_ == iVar8);
      auVar24._12_4_ = -(uint)(auVar15._12_4_ == iVar9);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar15 = auVar24 & auVar17 | auVar30;
      auVar15 = packssdw(auVar15,auVar15);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar1,auVar15 ^ auVar1);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 4) = uVar3;
      }
      auVar18 = pshufhw(auVar17,auVar17,0x84);
      auVar25 = pshufhw(auVar24,auVar24,0x84);
      auVar16 = pshufhw(auVar18,auVar30,0x84);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar19 = (auVar16 | auVar25 & auVar18) ^ auVar19;
      auVar18 = packssdw(auVar19,auVar19);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 6) = uVar3;
      }
      auVar18 = auVar12 ^ auVar4;
      iVar28 = -(uint)(iVar29 < auVar18._0_4_);
      auVar21._4_4_ = -(uint)(iVar8 < auVar18._4_4_);
      iVar32 = -(uint)(iVar33 < auVar18._8_4_);
      auVar21._12_4_ = -(uint)(iVar9 < auVar18._12_4_);
      auVar26._4_4_ = iVar28;
      auVar26._0_4_ = iVar28;
      auVar26._8_4_ = iVar32;
      auVar26._12_4_ = iVar32;
      auVar15 = pshuflw(auVar15,auVar26,0xe8);
      auVar20._4_4_ = -(uint)(auVar18._4_4_ == iVar8);
      auVar20._12_4_ = -(uint)(auVar18._12_4_ == iVar9);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      in_XMM12 = pshuflw(auVar36 & auVar34,auVar20,0xe8);
      in_XMM12 = in_XMM12 & auVar15;
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      auVar15 = pshuflw(auVar15,auVar21,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar15 | in_XMM12) ^ auVar34;
      auVar15 = packssdw(auVar34,auVar34);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 8) = uVar3;
      }
      auVar21 = auVar20 & auVar26 | auVar21;
      auVar15 = packssdw(auVar21,auVar21);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar15 = packssdw(auVar15 ^ auVar36,auVar15 ^ auVar36);
      if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 10) = uVar3;
      }
      auVar15 = auVar10 ^ auVar4;
      iVar29 = -(uint)(iVar29 < auVar15._0_4_);
      auVar31._4_4_ = -(uint)(iVar8 < auVar15._4_4_);
      iVar33 = -(uint)(iVar33 < auVar15._8_4_);
      auVar31._12_4_ = -(uint)(iVar9 < auVar15._12_4_);
      auVar22._4_4_ = iVar29;
      auVar22._0_4_ = iVar29;
      auVar22._8_4_ = iVar33;
      auVar22._12_4_ = iVar33;
      auVar27._4_4_ = -(uint)(auVar15._4_4_ == iVar8);
      auVar27._12_4_ = -(uint)(auVar15._12_4_ == iVar9);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar15 = auVar27 & auVar22 | auVar31;
      auVar15 = packssdw(auVar15,auVar15);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar15 ^ auVar2,auVar15 ^ auVar2);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 0xc) = uVar3;
      }
      auVar15 = pshufhw(auVar22,auVar22,0x84);
      auVar16 = pshufhw(auVar27,auVar27,0x84);
      auVar18 = pshufhw(auVar15,auVar31,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar18 | auVar16 & auVar15) ^ auVar23;
      auVar15 = packssdw(auVar23,auVar23);
      if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)ms_in + uVar6 + 0xe) = uVar3;
      }
      lVar11 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar11 + 8;
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar11 + 8;
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 8;
      auVar12._8_8_ = lVar11 + 8;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 8;
      auVar10._8_8_ = lVar11 + 8;
      uVar6 = uVar6 + 0x10;
    } while ((factor1 * 2 + 0xe & 0xfffffffffffffff0) != uVar6);
  }
  pNVar5 = ntru_encode_schedule(ms_in,factor1);
  safefree(ms_in);
  return pNVar5;
}

Assistant:

static NTRUEncodeSchedule *ntru_encode_pubkey_schedule(unsigned p, unsigned q)
{
    uint16_t *ms = snewn(p, uint16_t);
    for (size_t i = 0; i < p; i++)
        ms[i] = q;
    NTRUEncodeSchedule *sched = ntru_encode_schedule(ms, p);
    sfree(ms);
    return sched;
}